

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::anon_unknown_0::ThingImpl::intercept(ThingImpl *this,InterceptContext context)

{
  ArrayPtr<const_char> local_88 [2];
  Maybe<capnp::MessageSize> local_60;
  Builder local_48;
  CallContextHook *local_20;
  ThingImpl *this_local;
  InterceptContext context_local;
  
  local_20 = context.hook;
  context_local.hook = (CallContextHook *)this;
  kj::Maybe<capnp::MessageSize>::Maybe();
  CallContext<capnproto_test::capnp::test::TestMembrane::Thing::InterceptParams,_capnproto_test::capnp::test::TestMembrane::Result>
  ::getResults(&local_48,
               (CallContext<capnproto_test::capnp::test::TestMembrane::Thing::InterceptParams,_capnproto_test::capnp::test::TestMembrane::Result>
                *)&this_local,&local_60);
  Text::Reader::Reader((Reader *)local_88,(StringPtr *)(context.hook + 1));
  capnproto_test::capnp::test::TestMembrane::Result::Builder::setText(&local_48,(Reader)local_88[0])
  ;
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_60);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> intercept(InterceptContext context) override {
    context.getResults().setText(text);
    return kj::READY_NOW;
  }